

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::
GetAsyncCommandResponse_SetupDataSource
          (GetAsyncCommandResponse_SetupDataSource *this,
          GetAsyncCommandResponse_SetupDataSource *param_1)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_SetupDataSource_00409470;
  this->new_instance_id_ = param_1->new_instance_id_;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceConfig>::CopyablePtr
            (&this->config_,&param_1->config_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GetAsyncCommandResponse_SetupDataSource::GetAsyncCommandResponse_SetupDataSource(GetAsyncCommandResponse_SetupDataSource&&) noexcept = default;